

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

Am_String remove_extra_quotes(Am_String *filename)

{
  char *__s;
  size_t sVar1;
  Am_String *in_RSI;
  int iVar2;
  
  __s = Am_String::operator_cast_to_char_(in_RSI);
  if (*__s == '\"') {
    sVar1 = strlen(__s);
    iVar2 = (int)sVar1;
    if (2 < iVar2) {
      memmove(__s,__s + 1,(ulong)(iVar2 - 2));
    }
    __s[iVar2 + -2] = __s[iVar2];
    Am_String::operator=(in_RSI,__s);
  }
  Am_String::Am_String(filename,in_RSI);
  return (Am_String)(Am_String_Data *)filename;
}

Assistant:

Am_String
remove_extra_quotes(Am_String filename)
{
  char *s = filename;
  if (s[0] == '\"') {
    int len = strlen(s);
    for (int i = 1; i < len - 1; i++)
      s[i - 1] = s[i];
    s[len - 2] = s[len];
    filename = s;
  }
  return filename;
}